

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxDynamicCast::Resolve(FxDynamicCast *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  FxTypeCast *this_00;
  PPointer *pPVar4;
  undefined4 extraout_var_00;
  PClass *size;
  FxExpression *pFVar3;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->expr != (FxExpression *)0x0) {
      iVar2 = (*this->expr->_vptr_FxExpression[2])();
      pFVar3 = (FxExpression *)CONCAT44(extraout_var,iVar2);
      this->expr = pFVar3;
      if (pFVar3 != (FxExpression *)0x0) {
        size = PPointer::RegistrationInfo.MyClass;
        bVar1 = DObject::IsKindOf((DObject *)pFVar3->ValueType,PPointer::RegistrationInfo.MyClass);
        if ((bVar1) &&
           (*(char *)&this->expr->ValueType[1].super_PTypeBase.super_DObject.Class == '\x01')) {
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,"Cannot cast a readonly pointer");
        }
        else {
          this_00 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
          pFVar3 = this->expr;
          pPVar4 = NewPointer((PType *)DObject::RegistrationInfo.MyClass,false);
          FxTypeCast::FxTypeCast(this_00,pFVar3,(PType *)pPVar4,true,true);
          this->expr = (FxExpression *)this_00;
          iVar2 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00);
          this->expr = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
          if ((FxExpression *)CONCAT44(extraout_var_00,iVar2) != (FxExpression *)0x0) {
            pPVar4 = NewPointer((PType *)this->CastType,false);
            (this->super_FxExpression).ValueType = (PType *)pPVar4;
            return &this->super_FxExpression;
          }
        }
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxDynamicCast *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxDynamicCast::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(expr, ctx);
	if (expr->ExprType == EFX_GetDefaultByType)
	{
		int a = 0;
	}
	bool constflag = expr->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) && static_cast<PPointer *>(expr->ValueType)->IsConst;
	if (constflag)
	{
		// readonly pointers are normally only used for class defaults which lack type information to be cast properly, so we have to error out here.
		ScriptPosition.Message(MSG_ERROR, "Cannot cast a readonly pointer");
		delete this;
		return nullptr;
	}
	expr = new FxTypeCast(expr, NewPointer(RUNTIME_CLASS(DObject), constflag), true, true);
	expr = expr->Resolve(ctx);
	if (expr == nullptr)
	{
		delete this;
		return nullptr;
	}
	ValueType = NewPointer(CastType, constflag);
	return this;
}